

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

double __thiscall soplex::SVectorBase<double>::minAbs(SVectorBase<double> *this)

{
  double *pdVar1;
  SVectorBase<double> *in_RDI;
  Real RVar2;
  int i;
  double mini;
  int local_14;
  double local_10;
  
  pdVar1 = (double *)infinity();
  local_10 = *pdVar1;
  local_14 = size(in_RDI);
  while (local_14 = local_14 + -1, -1 < local_14) {
    RVar2 = spxAbs<double>(in_RDI->m_elem[local_14].val);
    if (RVar2 < local_10) {
      local_10 = spxAbs<double>(in_RDI->m_elem[local_14].val);
    }
  }
  return local_10;
}

Assistant:

R minAbs() const
   {
      R mini = R(infinity);

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) < mini)
            mini = spxAbs(m_elem[i].val);
      }

      assert(mini >= 0);

      return mini;
   }